

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall SymbolTable::cInsert(SymbolTable *this,Symbol *symbol,char *lexeme)

{
  int iVar1;
  Symbol **ppSVar2;
  unsigned_long uVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  ulong __size;
  allocator local_49;
  string local_48;
  
  if (lexeme != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_48,lexeme,&local_49);
    uVar3 = cHash(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    ppSVar2 = this->block;
    symbol->nextSymbol = ppSVar2[uVar3];
    ppSVar2[uVar3] = symbol;
    lVar6 = (long)this->headIndex;
    sVar4 = strlen(lexeme);
    if (sVar4 + lVar6 < (ulong)(uint)this->lexemeArraySize) {
      pcVar5 = this->lexemeArray;
    }
    else {
      __size = (ulong)this->lexemeArraySize;
      while( true ) {
        sVar4 = strlen(lexeme);
        if (sVar4 + lVar6 < (__size & 0xffffffff)) break;
        __size = __size + 0x1000;
        this->lexemeArraySize = (int)__size;
      }
      pcVar5 = (char *)realloc(this->lexemeArray,__size);
      this->lexemeArray = pcVar5;
      lVar6 = (long)this->headIndex;
    }
    strcpy(pcVar5 + lVar6,lexeme);
    iVar1 = this->headIndex;
    symbol->lexemeIndex = iVar1;
    sVar4 = strlen(lexeme);
    this->headIndex = (int)sVar4 + iVar1 + 1;
  }
  return;
}

Assistant:

void SymbolTable::cInsert(Symbol *symbol, const char *lexeme) {
    if (lexeme != NULL) {
        unsigned long index = cHash(lexeme);
        symbol->setNextSymbol(block[index]);
        block[index] = symbol;
        if (headIndex + strlen(lexeme) >= (unsigned) lexemeArraySize) {
            while (headIndex + strlen(lexeme) >= (unsigned) lexemeArraySize)
                lexemeArraySize += LEXEME_ARRAY_SIZE;
//            lexemeArraySize += (1 + strlen(lexeme)/LEXEME_ARRAY_SIZE)*LEXEME_ARRAY_SIZE;
            lexemeArray = (char *) realloc(lexemeArray, lexemeArraySize * sizeof(char));
        }
        strcpy(lexemeArray + headIndex, lexeme);
        symbol->setLexemeIndex(headIndex);
        headIndex += (int) strlen(lexeme) + 1;
    }
}